

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O0

bool Jinx::Impl::StringToInteger(String *value,int64_t *outValue)

{
  char *pcVar1;
  longlong lVar2;
  size_type sVar3;
  char *local_28;
  char *endPtr;
  int64_t *outValue_local;
  String *value_local;
  
  endPtr = (char *)outValue;
  outValue_local = (int64_t *)value;
  if (outValue != (int64_t *)0x0) {
    pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::data
                       (value);
    lVar2 = strtoll(pcVar1,&local_28,10);
    *(longlong *)endPtr = lVar2;
    pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                        outValue_local);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       outValue_local);
    return local_28 == pcVar1 + sVar3;
  }
  __assert_fail("outValue",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxConversion.cpp"
                ,0x82,"bool Jinx::Impl::StringToInteger(const String &, int64_t *)");
}

Assistant:

inline_t bool StringToInteger(const String & value, int64_t * outValue)
	{
		assert(outValue);
#ifdef JINX_USE_FROM_CHARS
		auto result = std::from_chars(value.data(), value.data() + value.size(), *outValue);
		if (result.ptr == value.data() + value.size())
			return true;
		return false;
#else
		char * endPtr;
		*outValue = strtoll(value.data(), &endPtr, 10);
		if (endPtr != (value.data() + value.size()))
			return false;
		return true;
#endif
	}